

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

long anon_unknown.dwarf_71df6::roundtrip<long>(long *in)

{
  Result *in_R9;
  ExpressionDecomposer local_1dc;
  long out;
  Expression_lhs<unsigned_long> local_1d0;
  Result local_1c0;
  OutputStream ostream;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::serialize<long,OutputStream>(in,&ostream);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1dc,DT_CHECK);
  local_1d0.lhs = std::ostream::tellp();
  local_1d0.m_at = local_1dc.m_at;
  out = 8;
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (&local_1c0,&local_1d0,(unsigned_long *)&out);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x36,0x18c3cc,&local_1c0.m_passed,in_R9);
  doctest::String::~String(&local_1c0.m_decomp);
  local_1d0.lhs = (unsigned_long)&stream;
  mserialize::detail::TrivialDeserializer<long>::deserialize<InputStream>
            (&out,(InputStream *)&local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return out;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}